

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O1

ze_result_t validation_layer::zesFanSetDefaultMode(zes_fan_handle_t hFan)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ze_result_t unaff_EBP;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_8c;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesFanSetDefaultMode(hFan)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(context + 0xc60);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar3 = *(long *)(context + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    local_8c = unaff_EBP;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar7 * 8) + 8);
        local_8c = (**(code **)(*plVar4 + 0x370))(plVar4,hFan);
        if (local_8c != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesFanSetDefaultMode",local_8c);
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
        local_8c = unaff_EBP;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    if (bVar9) {
      return local_8c;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZESHandleLifetimeValidation::zesFanSetDefaultModePrologue
                          ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hFan),
       zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zesFanSetDefaultMode",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hFan);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8) + 8);
        result = (**(code **)(*plVar4 + 0x378))(plVar4,hFan,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zesFanSetDefaultMode",result);
          local_8c = result;
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return local_8c;
    }
  }
  logAndPropagateResult("zesFanSetDefaultMode",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFanSetDefaultMode(
        zes_fan_handle_t hFan                           ///< [in] Handle for the component.
        )
    {
        context.logger->log_trace("zesFanSetDefaultMode(hFan)");

        auto pfnSetDefaultMode = context.zesDdiTable.Fan.pfnSetDefaultMode;

        if( nullptr == pfnSetDefaultMode )
            return logAndPropagateResult("zesFanSetDefaultMode", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesFanSetDefaultModePrologue( hFan );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFanSetDefaultMode", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesFanSetDefaultModePrologue( hFan );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFanSetDefaultMode", result);
        }

        auto driver_result = pfnSetDefaultMode( hFan );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesFanSetDefaultModeEpilogue( hFan ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesFanSetDefaultMode", result);
        }

        return logAndPropagateResult("zesFanSetDefaultMode", driver_result);
    }